

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boundary_Uniform.cpp
# Opt level: O2

void __thiscall
Nova::Boundary_Uniform<float,_3>::Fill_Single_Ghost_Region
          (Boundary_Uniform<float,_3> *this,T_Grid *grid,T_Arrays *u_ghost,int side,float dt,
          float time,Range<int,_3> *region)

{
  float fVar1;
  float fVar2;
  bool bVar3;
  Range<int,_3> *this_00;
  int *piVar4;
  float *pfVar5;
  int iVar6;
  int i;
  uint uVar7;
  uint uVar8;
  float fVar9;
  T_Index index;
  T_Index boundary_index;
  Cell_Iterator iterator;
  
  i = side / 2;
  this_00 = (Range<int,_3> *)&region->max_corner;
  if ((side & 1U) != 0) {
    this_00 = region;
  }
  piVar4 = Vector<int,_3,_true>::operator[](&this_00->min_corner,i);
  iVar6 = (-(side & 1U) | 1) + *piVar4;
  Grid_Iterator<float,_3>::Grid_Iterator(&iterator.super_Grid_Iterator<float,_3>,grid,region);
  if ((this->super_Boundary<float,_3>).use_fixed_boundary == true) {
    while (iterator.super_Grid_Iterator<float,_3>.valid == true) {
      index._data._M_elems[2] = iterator.super_Grid_Iterator<float,_3>.index._data._M_elems[2];
      index._data._M_elems[0] = iterator.super_Grid_Iterator<float,_3>.index._data._M_elems[0];
      index._data._M_elems[1] = iterator.super_Grid_Iterator<float,_3>.index._data._M_elems[1];
      fVar9 = (this->super_Boundary<float,_3>).fixed_boundary_value;
      pfVar5 = Array_ND<float,_3>::operator()(u_ghost,&index);
      *pfVar5 = fVar9;
      Grid_Iterator<float,_3>::Next(&iterator.super_Grid_Iterator<float,_3>);
    }
  }
  else {
    bVar3 = (this->super_Boundary<float,_3>).clamp_above;
    if ((this->super_Boundary<float,_3>).clamp_below == true) {
      if (bVar3 == false) {
        while (iterator.super_Grid_Iterator<float,_3>.valid == true) {
          index._data._M_elems[2] = iterator.super_Grid_Iterator<float,_3>.index._data._M_elems[2];
          index._data._M_elems[0] = iterator.super_Grid_Iterator<float,_3>.index._data._M_elems[0];
          index._data._M_elems[1] = iterator.super_Grid_Iterator<float,_3>.index._data._M_elems[1];
          boundary_index._data._M_elems[2] =
               iterator.super_Grid_Iterator<float,_3>.index._data._M_elems[2];
          boundary_index._data._M_elems[0] =
               iterator.super_Grid_Iterator<float,_3>.index._data._M_elems[0];
          boundary_index._data._M_elems[1] =
               iterator.super_Grid_Iterator<float,_3>.index._data._M_elems[1];
          piVar4 = Vector<int,_3,_true>::operator[](&boundary_index,i);
          *piVar4 = iVar6;
          pfVar5 = Array_ND<float,_3>::operator()(u_ghost,&boundary_index);
          fVar9 = (this->super_Boundary<float,_3>).lower_threshold;
          if (fVar9 <= *pfVar5) {
            fVar9 = *pfVar5;
          }
          pfVar5 = Array_ND<float,_3>::operator()(u_ghost,&index);
          *pfVar5 = fVar9;
          Grid_Iterator<float,_3>::Next(&iterator.super_Grid_Iterator<float,_3>);
        }
      }
      else {
        while (iterator.super_Grid_Iterator<float,_3>.valid == true) {
          index._data._M_elems[2] = iterator.super_Grid_Iterator<float,_3>.index._data._M_elems[2];
          index._data._M_elems[0] = iterator.super_Grid_Iterator<float,_3>.index._data._M_elems[0];
          index._data._M_elems[1] = iterator.super_Grid_Iterator<float,_3>.index._data._M_elems[1];
          boundary_index._data._M_elems[2] =
               iterator.super_Grid_Iterator<float,_3>.index._data._M_elems[2];
          boundary_index._data._M_elems[0] =
               iterator.super_Grid_Iterator<float,_3>.index._data._M_elems[0];
          boundary_index._data._M_elems[1] =
               iterator.super_Grid_Iterator<float,_3>.index._data._M_elems[1];
          piVar4 = Vector<int,_3,_true>::operator[](&boundary_index,i);
          *piVar4 = iVar6;
          pfVar5 = Array_ND<float,_3>::operator()(u_ghost,&boundary_index);
          fVar9 = *pfVar5;
          fVar1 = (this->super_Boundary<float,_3>).lower_threshold;
          fVar2 = (this->super_Boundary<float,_3>).upper_threshold;
          uVar7 = -(uint)(fVar2 <= fVar9);
          uVar8 = -(uint)(fVar1 < fVar9);
          pfVar5 = Array_ND<float,_3>::operator()(u_ghost,&index);
          *pfVar5 = (float)(~uVar8 & (uint)fVar1 |
                           (uVar7 & (uint)fVar2 | ~uVar7 & (uint)fVar9) & uVar8);
          Grid_Iterator<float,_3>::Next(&iterator.super_Grid_Iterator<float,_3>);
        }
      }
    }
    else if (bVar3 == false) {
      while (iterator.super_Grid_Iterator<float,_3>.valid == true) {
        index._data._M_elems[2] = iterator.super_Grid_Iterator<float,_3>.index._data._M_elems[2];
        index._data._M_elems[0] = iterator.super_Grid_Iterator<float,_3>.index._data._M_elems[0];
        index._data._M_elems[1] = iterator.super_Grid_Iterator<float,_3>.index._data._M_elems[1];
        boundary_index._data._M_elems[2] =
             iterator.super_Grid_Iterator<float,_3>.index._data._M_elems[2];
        boundary_index._data._M_elems[0] =
             iterator.super_Grid_Iterator<float,_3>.index._data._M_elems[0];
        boundary_index._data._M_elems[1] =
             iterator.super_Grid_Iterator<float,_3>.index._data._M_elems[1];
        piVar4 = Vector<int,_3,_true>::operator[](&boundary_index,i);
        *piVar4 = iVar6;
        pfVar5 = Array_ND<float,_3>::operator()(u_ghost,&boundary_index);
        fVar9 = *pfVar5;
        pfVar5 = Array_ND<float,_3>::operator()(u_ghost,&index);
        *pfVar5 = fVar9;
        Grid_Iterator<float,_3>::Next(&iterator.super_Grid_Iterator<float,_3>);
      }
    }
    else {
      while (iterator.super_Grid_Iterator<float,_3>.valid == true) {
        index._data._M_elems[2] = iterator.super_Grid_Iterator<float,_3>.index._data._M_elems[2];
        index._data._M_elems[0] = iterator.super_Grid_Iterator<float,_3>.index._data._M_elems[0];
        index._data._M_elems[1] = iterator.super_Grid_Iterator<float,_3>.index._data._M_elems[1];
        boundary_index._data._M_elems[2] =
             iterator.super_Grid_Iterator<float,_3>.index._data._M_elems[2];
        boundary_index._data._M_elems[0] =
             iterator.super_Grid_Iterator<float,_3>.index._data._M_elems[0];
        boundary_index._data._M_elems[1] =
             iterator.super_Grid_Iterator<float,_3>.index._data._M_elems[1];
        piVar4 = Vector<int,_3,_true>::operator[](&boundary_index,i);
        *piVar4 = iVar6;
        pfVar5 = Array_ND<float,_3>::operator()(u_ghost,&boundary_index);
        fVar9 = (this->super_Boundary<float,_3>).upper_threshold;
        if (*pfVar5 <= fVar9) {
          fVar9 = *pfVar5;
        }
        pfVar5 = Array_ND<float,_3>::operator()(u_ghost,&index);
        *pfVar5 = fVar9;
        Grid_Iterator<float,_3>::Next(&iterator.super_Grid_Iterator<float,_3>);
      }
    }
  }
  return;
}

Assistant:

void Boundary_Uniform<T,d>::
Fill_Single_Ghost_Region(const T_Grid& grid,T_Arrays& u_ghost,const int side,const T dt,const T time,const Range<int,d>& region) const
{
    using Cell_Iterator         = Grid_Iterator_Cell<T,d>;

    int axis=side/2,boundary=(side%2==0)?region.max_corner[axis]+1:region.min_corner[axis]-1;
    Cell_Iterator iterator(grid,region);
    if(use_fixed_boundary) for(;iterator.Valid();iterator.Next()){T_Index index=iterator.Cell_Index();
        u_ghost(index)=fixed_boundary_value;}
    else if(clamp_below&&clamp_above) for(;iterator.Valid();iterator.Next()){T_Index index=iterator.Cell_Index(),boundary_index=index;boundary_index[axis]=boundary;
        u_ghost(index)=Nova_Utilities::Clamp<T>(u_ghost(boundary_index),lower_threshold,upper_threshold);}
    else if(clamp_below) for(;iterator.Valid();iterator.Next()){T_Index index=iterator.Cell_Index(),boundary_index=index;boundary_index[axis]=boundary;
        u_ghost(index)=std::max(u_ghost(boundary_index),lower_threshold);}
    else if(clamp_above) for(;iterator.Valid();iterator.Next()){T_Index index=iterator.Cell_Index(),boundary_index=index;boundary_index[axis]=boundary;
        u_ghost(index)=std::min(u_ghost(boundary_index),upper_threshold);}
    else for(;iterator.Valid();iterator.Next()){T_Index index=iterator.Cell_Index(),boundary_index=index;boundary_index[axis]=boundary;
        u_ghost(index)=u_ghost(boundary_index);}
}